

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthMuxVarPhase(uint *pOut,uint *pCof0,uint *pCof1,int nVars,int iVar,int fCompl0)

{
  int iVar1;
  ulong uVar2;
  uint *puVar3;
  uint *puVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  uint *puVar11;
  
  uVar8 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar8 = 1;
  }
  if (fCompl0 == 0) {
    Kit_TruthMuxVar(pOut,pCof0,pCof1,nVars,iVar);
    return;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                  ,0x470,
                  "void Kit_TruthMuxVarPhase(unsigned int *, unsigned int *, unsigned int *, int, int, int)"
                 );
  }
  switch(iVar) {
  case 0:
    uVar2 = 0;
    uVar7 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar7 = uVar2;
    }
    for (; uVar7 != uVar2; uVar2 = uVar2 + 1) {
      pOut[uVar2] = (pCof1[uVar2] & 0xaaaaaaaa | pCof0[uVar2] & 0x55555555) ^ 0x55555555;
    }
    break;
  case 1:
    uVar2 = 0;
    uVar7 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar7 = uVar2;
    }
    for (; uVar7 != uVar2; uVar2 = uVar2 + 1) {
      pOut[uVar2] = (pCof1[uVar2] & 0xcccccccc | pCof0[uVar2] & 0x33333333) ^ 0x33333333;
    }
    break;
  case 2:
    uVar2 = 0;
    uVar7 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar7 = uVar2;
    }
    for (; uVar7 != uVar2; uVar2 = uVar2 + 1) {
      pOut[uVar2] = (pCof1[uVar2] & 0xf0f0f0f0 | pCof0[uVar2] & 0xf0f0f0f) ^ 0xf0f0f0f;
    }
    break;
  case 3:
    uVar2 = 0;
    uVar7 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar7 = uVar2;
    }
    for (; uVar7 != uVar2; uVar2 = uVar2 + 1) {
      pOut[uVar2] = (pCof1[uVar2] & 0xff00ff00 | pCof0[uVar2] & 0xff00ff) ^ 0xff00ff;
    }
    break;
  case 4:
    uVar2 = 0;
    uVar7 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar7 = uVar2;
    }
    for (; uVar7 != uVar2; uVar2 = uVar2 + 1) {
      pOut[uVar2] = CONCAT22(*(undefined2 *)((long)pCof1 + uVar2 * 4 + 2),(short)pCof0[uVar2]) ^
                    0xffff;
    }
    break;
  default:
    bVar5 = (char)iVar - 5;
    uVar9 = 1 << (bVar5 & 0x1f);
    iVar1 = 2 << (bVar5 & 0x1f);
    iVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar9) {
      uVar7 = (ulong)uVar9;
    }
    puVar3 = pCof1 + (int)uVar9;
    for (; puVar4 = puVar3, uVar2 = uVar7, puVar10 = pCof0, puVar11 = pOut, iVar6 < (int)uVar8;
        iVar6 = iVar6 + iVar1) {
      while (uVar2 != 0) {
        *puVar11 = ~*puVar10;
        puVar11[(int)uVar9] = *puVar4;
        puVar4 = puVar4 + 1;
        uVar2 = uVar2 - 1;
        puVar10 = puVar10 + 1;
        puVar11 = puVar11 + 1;
      }
      pOut = pOut + iVar1;
      pCof0 = pCof0 + iVar1;
      puVar3 = puVar3 + iVar1;
    }
  }
  return;
}

Assistant:

void Kit_TruthMuxVarPhase( unsigned * pOut, unsigned * pCof0, unsigned * pCof1, int nVars, int iVar, int fCompl0 )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    if ( fCompl0 == 0 )
    {
        Kit_TruthMuxVar( pOut, pCof0, pCof1, nVars, iVar );
        return;
    }

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~pCof0[i] & 0x55555555) | (pCof1[i] & 0xAAAAAAAA);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~pCof0[i] & 0x33333333) | (pCof1[i] & 0xCCCCCCCC);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~pCof0[i] & 0x0F0F0F0F) | (pCof1[i] & 0xF0F0F0F0);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~pCof0[i] & 0x00FF00FF) | (pCof1[i] & 0xFF00FF00);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~pCof0[i] & 0x0000FFFF) | (pCof1[i] & 0xFFFF0000);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pOut[i]      = ~pCof0[i];
                pOut[Step+i] = pCof1[Step+i];
            }
            pOut += 2*Step;
            pCof0 += 2*Step;
            pCof1 += 2*Step;
        }
        return;
    }
}